

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O0

void __thiscall GdlSetAttrItem::FixFeatureTestsInRules(GdlSetAttrItem *this,GrcFont *pfont)

{
  GrcFont *pGVar1;
  GdlRuleItem *in_RDI;
  size_t iavs;
  GrcFont *in_stack_ffffffffffffffd8;
  GrcFont *pfont_00;
  GrcFont *local_18;
  
  GdlRuleItem::FixFeatureTestsInRules(in_RDI,in_stack_ffffffffffffffd8);
  local_18 = (GrcFont *)0x0;
  while( true ) {
    pfont_00 = local_18;
    pGVar1 = (GrcFont *)
             std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::size
                       ((vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_> *)
                        (in_RDI + 1));
    if (pGVar1 <= pfont_00) break;
    std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::operator[]
              ((vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_> *)(in_RDI + 1),
               (size_type_conflict)local_18);
    GdlAttrValueSpec::FixFeatureTestsInRules((GdlAttrValueSpec *)in_RDI,pfont_00);
    local_18 = (GrcFont *)((long)&local_18->m_pchFileName + 1);
  }
  return;
}

Assistant:

void GdlSetAttrItem::FixFeatureTestsInRules(GrcFont * pfont)
{
	GdlRuleItem::FixFeatureTestsInRules(pfont);

	for (size_t iavs = 0; iavs < this->m_vpavs.size(); iavs++)
		m_vpavs[iavs]->FixFeatureTestsInRules(pfont);
}